

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O0

void __thiscall helics::FilterFederate::handleMessage(FilterFederate *this,ActionMessage *command)

{
  __tuple_element_t<1UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> _Var1;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  __last;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  __first;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  Time newMessageTime;
  bool bVar2;
  action_t aVar3;
  __tuple_element_t<2UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var4;
  __tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var5;
  __tuple_element_t<1UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *p_Var6;
  reference pGVar7;
  FilterCoordinator *pFVar8;
  FilterInfo *pFVar9;
  BasicHandleInfo *pBVar10;
  TimeCoordinator *this_00;
  FilterFederate *in_RSI;
  Time in_RDI;
  string_view sVar11;
  shared_ptr<helics::FilterOperator> M;
  optional<std::any> op;
  FilterInfo *filtI_3;
  BasicHandleInfo *filthandle_1;
  FilterInfo *filtI_2;
  ActionMessage disconnect_1;
  BasicHandleInfo *filthandle;
  FilterInfo *filtI_1;
  FilterInfo *filtI;
  FilterCoordinator *filterC;
  GlobalHandle *target_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range4_1;
  GlobalHandle *target;
  iterator __end4;
  iterator __begin4;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *__range4;
  ActionMessage rem;
  FilterInfo *filt;
  string errorString;
  ActionMessage echeck;
  ActionMessage disconnect;
  tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> proc_result;
  undefined4 in_stack_fffffffffffffa48;
  int in_stack_fffffffffffffa4c;
  GlobalHandle in_stack_fffffffffffffa50;
  undefined7 in_stack_fffffffffffffa58;
  undefined7 uVar12;
  InterfaceType in_stack_fffffffffffffa5f;
  undefined4 in_stack_fffffffffffffa60;
  int in_stack_fffffffffffffa64;
  undefined4 in_stack_fffffffffffffa68;
  InterfaceHandle in_stack_fffffffffffffa6c;
  InterfaceHandle in_stack_fffffffffffffa70;
  GlobalFederateId in_stack_fffffffffffffa74;
  AirLock<std::any,_std::mutex,_std::condition_variable> *in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa8c;
  undefined4 uVar13;
  GlobalFederateId in_stack_fffffffffffffa90;
  FilterFederate *in_stack_fffffffffffffaa0;
  InterfaceHandle in_stack_fffffffffffffaac;
  undefined7 in_stack_fffffffffffffab8;
  undefined1 in_stack_fffffffffffffabf;
  GlobalHandle in_stack_fffffffffffffac0;
  undefined7 in_stack_fffffffffffffad0;
  __tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> _Var14;
  Time in_stack_fffffffffffffad8;
  FilterInfo *in_stack_fffffffffffffae8;
  GlobalHandle in_stack_fffffffffffffaf0;
  undefined8 in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  ActionMessage *in_stack_fffffffffffffb50;
  GlobalFederateId in_stack_fffffffffffffb5c;
  undefined4 in_stack_fffffffffffffc2c;
  IterationRequest mode;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  local_358;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *local_350;
  GlobalHandle local_348;
  reference local_340;
  GlobalHandle *local_338;
  __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
  local_330;
  vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *local_328;
  BaseType local_320;
  GlobalFederateId local_31c [3];
  BaseType local_310;
  BaseType local_30c;
  ActionMessage *in_stack_fffffffffffffd78;
  FilterFederate *in_stack_fffffffffffffd80;
  undefined1 local_1a0 [8];
  BaseType local_198;
  BaseType local_190;
  undefined4 local_d8;
  GlobalFederateId local_d4;
  undefined1 local_d0 [8];
  BaseType local_c8;
  BaseType local_c0;
  BaseType BVar15;
  undefined4 in_stack_ffffffffffffffec;
  
  mode = (IterationRequest)((uint)in_stack_fffffffffffffc2c >> 0x18);
  BVar15 = *(BaseType *)in_RDI.internalTimeCode;
  processCoordinatorMessage
            (in_stack_fffffffffffffb50,
             (TimeCoordinator *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (FederateStates)((ulong)in_stack_fffffffffffffb40 >> 0x38),
             SUB81((ulong)in_stack_fffffffffffffb40 >> 0x30,0),in_stack_fffffffffffffb5c);
  p_Var4 = std::get<2ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x64224d);
  if (((*p_Var4 & 1U) != 0) && ((char)*(BaseType *)(in_RDI.internalTimeCode + 0x298) == '\x02')) {
    BaseTimeCoordinator::disconnect
              ((BaseTimeCoordinator *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60))
    ;
    in_stack_fffffffffffffad8.internalTimeCode = (baseType)local_d0;
    ActionMessage::ActionMessage
              ((ActionMessage *)
               CONCAT44(in_stack_fffffffffffffa74.gid,in_stack_fffffffffffffa70.hid),
               in_stack_fffffffffffffa6c.hid);
    local_c8 = *(BaseType *)in_RDI.internalTimeCode;
    local_d8 = 0;
    GlobalFederateId::GlobalFederateId(&local_d4,(GlobalBrokerId)0x0);
    local_c0 = local_d4.gid;
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffa50,
               (ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa50);
  }
  _Var14 = *(__tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *)
            (in_RDI.internalTimeCode + 0x298);
  p_Var5 = std::get<0ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x642349);
  if (_Var14 != *p_Var5) {
    p_Var5 = std::get<0ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                       ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                        0x642368);
    *(__tuple_element_t<0UL,_tuple<FederateStates,_MessageProcessingResult,_bool>_> *)
     (in_RDI.internalTimeCode + 0x298) = *p_Var5;
    this_00 = (TimeCoordinator *)(ulong)(byte)(*(char *)(in_RDI.internalTimeCode + 0x298) - 1);
    switch(this_00) {
    case (TimeCoordinator *)0x0:
      TimeCoordinator::enteringExecMode
                ((TimeCoordinator *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30),
                 mode);
      in_stack_fffffffffffffac0 = (GlobalHandle)local_1a0;
      ActionMessage::ActionMessage
                ((ActionMessage *)
                 CONCAT44(in_stack_fffffffffffffa74.gid,in_stack_fffffffffffffa70.hid),
                 in_stack_fffffffffffffa6c.hid);
      local_190 = *(BaseType *)in_RDI.internalTimeCode;
      local_198 = *(BaseType *)in_RDI.internalTimeCode;
      handleMessage(in_RSI,(ActionMessage *)CONCAT44(in_stack_ffffffffffffffec,BVar15));
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa50);
      break;
    case (TimeCoordinator *)0x1:
      newMessageTime.internalTimeCode._7_1_ = _Var14;
      newMessageTime.internalTimeCode._0_7_ = in_stack_fffffffffffffad0;
      TimeCoordinator::timeRequest
                (this_00,in_RDI,in_stack_fffffffffffffac0.handle.hid._3_1_,in_stack_fffffffffffffad8
                 ,newMessageTime);
      break;
    default:
      break;
    case (TimeCoordinator *)0x3:
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      in_stack_fffffffffffffabf =
           SmallBuffer::empty((SmallBuffer *)
                              ((long)&(in_RSI->mCoord).super_BaseTimeCoordinator.dependencies.
                                      dependencies.
                                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                                      ._M_impl.super__Vector_impl_data + 0x10));
      if ((bool)in_stack_fffffffffffffabf) {
        commandErrorString(in_stack_fffffffffffffa64);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffffa50,
                  (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffa50,
                                (char *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48
                                                ));
        in_stack_fffffffffffffaac.hid = CONCAT13(bVar2,(int3)in_stack_fffffffffffffaac.hid);
        if (bVar2) {
          CLI::std::__cxx11::to_string(in_stack_fffffffffffffa8c);
          std::operator+((char *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffa50);
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          operator+=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa50,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa50);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffa50);
        }
      }
      else {
        sVar11 = SmallBuffer::to_string((SmallBuffer *)0x6425fb);
        in_stack_fffffffffffffaa0 = (FilterFederate *)sVar11._M_len;
        std::__cxx11::string::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa50,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      }
      bVar2 = std::function::operator_cast_to_bool
                        ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)0x64264e);
      if (bVar2) {
        in_stack_fffffffffffffa90.gid = (int)in_RDI.internalTimeCode + 0x370;
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa50);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa50);
        __args_1._M_len._4_4_ = in_stack_fffffffffffffa6c.hid;
        __args_1._M_len._0_4_ = in_stack_fffffffffffffa68;
        __args_1._M_str._0_4_ = in_stack_fffffffffffffa70.hid;
        __args_1._M_str._4_4_ = in_stack_fffffffffffffa74.gid;
        __args_2._M_len._7_1_ = in_stack_fffffffffffffa5f;
        __args_2._M_len._0_7_ = in_stack_fffffffffffffa58;
        __args_2._M_str._0_4_ = in_stack_fffffffffffffa60;
        __args_2._M_str._4_4_ = in_stack_fffffffffffffa64;
        std::
        function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c,__args_1,__args_2);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffa50);
      break;
    case (TimeCoordinator *)0x4:
    }
  }
  p_Var6 = std::get<1ul,helics::FederateStates,helics::MessageProcessingResult,bool>
                     ((tuple<helics::FederateStates,_helics::MessageProcessingResult,_bool> *)
                      0x642702);
  _Var1 = *p_Var6;
  uVar13 = CONCAT13(_Var1,(int3)in_stack_fffffffffffffa8c);
  if (_Var1 == CONTINUE_PROCESSING) {
    aVar3 = ActionMessage::action((ActionMessage *)in_RSI);
    if (aVar3 == cmd_disconnect) {
      if (((*(byte *)(in_RDI.internalTimeCode + 0x46c) & 1) == 0) &&
         (bVar2 = BaseTimeCoordinator::hasActiveTimeDependencies((BaseTimeCoordinator *)0x642d90),
         !bVar2)) {
        BaseTimeCoordinator::disconnect
                  ((BaseTimeCoordinator *)
                   CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffa74.gid,in_stack_fffffffffffffa70.hid),
                   in_stack_fffffffffffffa6c.hid);
        GlobalFederateId::GlobalFederateId
                  ((GlobalFederateId *)&stack0xfffffffffffffb5c,(GlobalBrokerId)0x0);
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffa50,
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa50);
      }
    }
    else if (aVar3 == cmd_add_endpoint) {
      pFVar9 = getFilterInfo((FilterFederate *)
                             CONCAT44(in_stack_fffffffffffffa6c.hid,in_stack_fffffffffffffa68),
                             in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
      if (pFVar9 != (FilterInfo *)0x0) {
        bVar2 = checkActionFlag<helics::ActionMessage,helics::InterfaceFlags>
                          ((ActionMessage *)in_RSI,destination_target);
        if (bVar2) {
          uVar12 = SUB87(&pFVar9->destTargets,0);
          in_stack_fffffffffffffa5f = (InterfaceType)((ulong)&pFVar9->destTargets >> 0x38);
          ActionMessage::getSource
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48))
          ;
          std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::
          emplace_back<helics::GlobalHandle>
                    ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                     (GlobalHandle *)CONCAT17(in_stack_fffffffffffffa5f,uVar12));
        }
        else {
          ActionMessage::getSource
                    ((ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48))
          ;
          std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::
          emplace_back<helics::GlobalHandle>
                    ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                     (GlobalHandle *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
        }
        bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>
                          ((ActionMessage *)in_RSI,error_flag);
        if ((!bVar2) && ((*(byte *)(in_RDI.internalTimeCode + 0x46c) & 1) == 0)) {
          TimeCoordinator::addDependency
                    ((TimeCoordinator *)CONCAT44(uVar13,aVar3),in_stack_fffffffffffffa90);
        }
      }
      pBVar10 = HandleManager::getInterfaceHandle
                          ((HandleManager *)
                           CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                           in_stack_fffffffffffffa6c,in_stack_fffffffffffffa5f);
      if (pBVar10 != (BasicHandleInfo *)0x0) {
        pBVar10->used = true;
      }
    }
    else if (aVar3 == cmd_close_interface) {
      ActionMessage::getSource
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      pFVar9 = gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::find
                         ((MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle> *)
                          CONCAT44(in_stack_fffffffffffffa6c.hid,in_stack_fffffffffffffa68),
                          (GlobalHandle *)
                          CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60));
      if (pFVar9 != (FilterInfo *)0x0) {
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffa74.gid,in_stack_fffffffffffffa70.hid),
                   in_stack_fffffffffffffa6c.hid);
        local_30c = (pFVar9->handle).hid;
        local_320 = (pFVar9->core_id).gid;
        GlobalFederateId::GlobalFederateId(local_31c,(GlobalBrokerId)local_320);
        local_310 = local_31c[0].gid;
        local_328 = &pFVar9->sourceTargets;
        local_330._M_current =
             (GlobalHandle *)
             std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                       ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                        CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        local_338 = (GlobalHandle *)
                    std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                              ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
                                *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        while (bVar2 = __gnu_cxx::
                       operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                 ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                   *)in_stack_fffffffffffffa50,
                                  (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48)),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          local_340 = __gnu_cxx::
                      __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                      ::operator*(&local_330);
          local_348 = *local_340;
          ActionMessage::setDestination((ActionMessage *)(local_31c + 1),local_348);
          std::function<void_(const_helics::ActionMessage_&)>::operator()
                    ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffa50,
                     (ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48))
          ;
          __gnu_cxx::
          __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
          ::operator++(&local_330);
        }
        local_350 = &pFVar9->destTargets;
        local_358._M_current =
             (GlobalHandle *)
             std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                       ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                        CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                  ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                   CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        while (bVar2 = __gnu_cxx::
                       operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                 ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                   *)in_stack_fffffffffffffa50,
                                  (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48)),
              ((bVar2 ^ 0xffU) & 1) != 0) {
          pGVar7 = __gnu_cxx::
                   __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                   ::operator*(&local_358);
          std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::begin
                    ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                     CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                    ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                     CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          __first._M_current._4_4_ = in_stack_fffffffffffffa6c.hid;
          __first._M_current._0_4_ = in_stack_fffffffffffffa68;
          __last._M_current._4_4_ = in_stack_fffffffffffffa64;
          __last._M_current._0_4_ = in_stack_fffffffffffffa60;
          std::
          find<__gnu_cxx::__normal_iterator<helics::GlobalHandle*,std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>>,helics::GlobalHandle>
                    (__first,__last,
                     (GlobalHandle *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
          std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::end
                    ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                     CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          bVar2 = __gnu_cxx::
                  operator==<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                            ((__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                              *)in_stack_fffffffffffffa50,
                             (__normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
                              *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            ActionMessage::setDestination((ActionMessage *)(local_31c + 1),*pGVar7);
            std::function<void_(const_helics::ActionMessage_&)>::operator()
                      ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffa50,
                       (ActionMessage *)
                       CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          }
          __gnu_cxx::
          __normal_iterator<helics::GlobalHandle_*,_std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>_>
          ::operator++(&local_358);
        }
        std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::clear
                  ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x642b41);
        std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::clear
                  ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)0x642b52);
        setActionFlag<helics::FilterInfo,helics::ConnectionFlags>(pFVar9,disconnected_flag);
        ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffa50);
      }
    }
    else if (aVar3 == cmd_remove_filter) {
      pFVar8 = getFilterCoordinator(in_stack_fffffffffffffaa0,in_stack_fffffffffffffaac);
      if (pFVar8 != (FilterCoordinator *)0x0) {
        ActionMessage::getSource
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        FilterCoordinator::closeFilter
                  ((FilterCoordinator *)
                   CONCAT17(in_stack_fffffffffffffabf,in_stack_fffffffffffffab8),
                   in_stack_fffffffffffffac0);
      }
    }
    else if (aVar3 == cmd_remove_endpoint) {
      ActionMessage::getDest
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
      pFVar9 = getFilterInfo((FilterFederate *)
                             CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                             in_stack_fffffffffffffa50);
      if (pFVar9 != (FilterInfo *)0x0) {
        ActionMessage::getSource
                  ((ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
        FilterInfo::removeTarget(in_stack_fffffffffffffae8,in_stack_fffffffffffffaf0);
      }
    }
    else if (aVar3 == cmd_core_configure) {
      if (((in_RSI->mCoreID).gid == 0x23c) &&
         (pFVar9 = getFilterInfo((FilterFederate *)
                                 CONCAT44(in_stack_fffffffffffffa6c.hid,in_stack_fffffffffffffa68),
                                 in_stack_fffffffffffffa74,in_stack_fffffffffffffa70),
         pFVar9 != (FilterInfo *)0x0)) {
        std::
        function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
        operator()((function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>
                    *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa4c);
        gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>::try_unload
                  (in_stack_fffffffffffffa78);
        bVar2 = std::optional::operator_cast_to_bool((optional<std::any> *)0x643090);
        if (bVar2) {
          std::optional<std::any>::operator*((optional<std::any> *)0x6430a3);
          std::any_cast<std::shared_ptr<helics::FilterOperator>>
                    ((any *)CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58));
          std::shared_ptr<helics::FilterOperator>::operator=
                    ((shared_ptr<helics::FilterOperator> *)in_stack_fffffffffffffa50,
                     (shared_ptr<helics::FilterOperator> *)
                     CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
          std::shared_ptr<helics::FilterOperator>::~shared_ptr
                    ((shared_ptr<helics::FilterOperator> *)0x6430de);
        }
        std::optional<std::any>::~optional((optional<std::any> *)0x643110);
      }
    }
    else if (aVar3 == cmd_reg_filter) {
      processFilterInfo(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    }
    else if (aVar3 == cmd_reg_end) {
      pFVar9 = getFilterInfo((FilterFederate *)
                             CONCAT44(in_stack_fffffffffffffa6c.hid,in_stack_fffffffffffffa68),
                             in_stack_fffffffffffffa74,in_stack_fffffffffffffa70);
      if ((pFVar9 != (FilterInfo *)0x0) &&
         (std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
          emplace_back<helics::GlobalFederateId&,helics::InterfaceHandle&>
                    ((vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> *)
                     CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                     (GlobalFederateId *)
                     CONCAT17(in_stack_fffffffffffffa5f,in_stack_fffffffffffffa58),
                     (InterfaceHandle *)in_stack_fffffffffffffa50),
         (*(byte *)(in_RDI.internalTimeCode + 0x46c) & 1) == 0)) {
        TimeCoordinator::addDependency
                  ((TimeCoordinator *)CONCAT44(uVar13,aVar3),in_stack_fffffffffffffa90);
      }
      pBVar10 = HandleManager::getInterfaceHandle
                          ((HandleManager *)
                           CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                           in_stack_fffffffffffffa6c,in_stack_fffffffffffffa5f);
      if (pBVar10 != (BasicHandleInfo *)0x0) {
        pBVar10->used = true;
      }
    }
  }
  else if ((_Var1 != DELAY_MESSAGE) && (_Var1 == REPROCESS_MESSAGE)) {
    bVar2 = GlobalFederateId::operator!=
                      ((GlobalFederateId *)&(in_RSI->mName)._M_string_length,
                       (GlobalFederateId)*(BaseType *)in_RDI.internalTimeCode);
    if (bVar2) {
      std::function<void_(const_helics::ActionMessage_&)>::operator()
                ((function<void_(const_helics::ActionMessage_&)> *)in_stack_fffffffffffffa50,
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48));
    }
    else {
      handleMessage(in_RSI,(ActionMessage *)CONCAT44(in_stack_ffffffffffffffec,BVar15));
    }
  }
  return;
}

Assistant:

void FilterFederate::handleMessage(ActionMessage& command)
{
    auto proc_result = processCoordinatorMessage(command, &mCoord, current_state, false, mFedID);

    if (std::get<2>(proc_result) && current_state == FederateStates::EXECUTING) {
        mCoord.disconnect();
        ActionMessage disconnect(CMD_DISCONNECT);
        disconnect.source_id = mFedID;
        disconnect.dest_id = parent_broker_id;
        mQueueMessage(disconnect);
    }
    if (current_state != std::get<0>(proc_result)) {
        current_state = std::get<0>(proc_result);
        switch (current_state) {
            case FederateStates::INITIALIZING:
                mCoord.enteringExecMode(IterationRequest::NO_ITERATIONS);
                {
                    ActionMessage echeck{CMD_EXEC_CHECK};
                    echeck.dest_id = mFedID;
                    echeck.source_id = mFedID;
                    handleMessage(echeck);
                }
                break;
            case FederateStates::EXECUTING:
                mCoord.timeRequest(cBigTime, IterationRequest::NO_ITERATIONS, cBigTime, cBigTime);
                break;
            case FederateStates::FINISHED:
                break;
            case FederateStates::ERRORED: {
                std::string errorString;
                if (command.payload.empty()) {
                    errorString = commandErrorString(command.messageID);
                    if (errorString == "unknown") {
                        errorString += " code:" + std::to_string(command.messageID);
                    }
                } else {
                    errorString = command.payload.to_string();
                }
                if (mLogger) {
                    mLogger(HELICS_LOG_LEVEL_ERROR, mName, errorString);
                }
            } break;
            default:
                break;
        }
    }

    switch (std::get<1>(proc_result)) {
        case MessageProcessingResult::CONTINUE_PROCESSING:
            break;
        case MessageProcessingResult::REPROCESS_MESSAGE:
            if (command.dest_id != mFedID) {
                mSendMessage(command);
                return;
            }
            return handleMessage(command);
        case MessageProcessingResult::DELAY_MESSAGE:
        default:
            return;
    }
    switch (command.action()) {
        case CMD_CLOSE_INTERFACE: {
            auto* filt = filters.find(command.getSource());
            if (filt != nullptr) {
                ActionMessage rem(CMD_REMOVE_FILTER);
                rem.source_handle = filt->handle;
                rem.source_id = filt->core_id;
                for (auto& target : filt->sourceTargets) {
                    rem.setDestination(target);
                    mSendMessage(rem);
                }
                for (auto& target : filt->destTargets) {
                    if (std::find(filt->sourceTargets.begin(), filt->sourceTargets.end(), target) !=
                        filt->sourceTargets.end()) {
                        rem.setDestination(target);
                        mSendMessage(rem);
                    }
                }
                filt->sourceTargets.clear();
                filt->destTargets.clear();
                setActionFlag(*filt, disconnected_flag);
            }
        } break;
        case CMD_REMOVE_FILTER: {
            auto* filterC = getFilterCoordinator(command.dest_handle);
            if (filterC == nullptr) {
                return;
            }
            filterC->closeFilter(command.getSource());
        } break;
        case CMD_REMOVE_ENDPOINT: {
            auto* filtI = getFilterInfo(command.getDest());
            if (filtI != nullptr) {
                filtI->removeTarget(command.getSource());
            }
        } break;
        case CMD_REG_ENDPOINT: {
            auto* filtI = getFilterInfo(mFedID, command.dest_handle);
            if (filtI != nullptr) {
                filtI->sourceTargets.emplace_back(command.source_id, command.source_handle);
                if (!usingGlobalTime) {
                    mCoord.addDependency(command.source_id);
                }
            }
            auto* filthandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::FILTER);
            if (filthandle != nullptr) {
                filthandle->used = true;
            }
        } break;
        case CMD_DISCONNECT:
            if (!usingGlobalTime && !mCoord.hasActiveTimeDependencies()) {
                mCoord.disconnect();
                ActionMessage disconnect(CMD_DISCONNECT);
                disconnect.source_id = mFedID;
                disconnect.dest_id = parent_broker_id;
                mQueueMessage(disconnect);
            }
            break;
        case CMD_REG_FILTER:
            processFilterInfo(command);
            break;
        case CMD_ADD_ENDPOINT: {
            auto* filtI = getFilterInfo(mFedID, command.dest_handle);
            if (filtI != nullptr) {
                if (checkActionFlag(command, destination_target)) {
                    filtI->destTargets.emplace_back(command.getSource());
                } else {
                    filtI->sourceTargets.emplace_back(command.getSource());
                }
                if (!checkActionFlag(command, error_flag)) {
                    if (!usingGlobalTime) {
                        mCoord.addDependency(command.source_id);
                    }
                }
            }

            auto* filthandle =
                mHandles->getInterfaceHandle(command.dest_handle, InterfaceType::FILTER);
            if (filthandle != nullptr) {
                filthandle->used = true;
            }
        } break;
        case CMD_CORE_CONFIGURE:
            if (command.messageID == UPDATE_FILTER_OPERATOR) {
                auto* filtI = getFilterInfo(mFedID, command.source_handle);
                if (filtI != nullptr) {
                    auto op = mGetAirLock(command.counter).try_unload();
                    if (op) {
                        auto M = std::any_cast<std::shared_ptr<FilterOperator>>(std::move(*op));
                        filtI->filterOp = std::move(M);
                    }
                }
            }
            break;
        default:
            break;
    }
}